

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall wasm_tabletype_t::wasm_tabletype_t(wasm_tabletype_t *this,TableType *tt)

{
  wasm_limits_t wVar1;
  undefined1 local_28 [8];
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_20;
  TableType *local_18;
  TableType *tt_local;
  wasm_tabletype_t *this_local;
  
  local_18 = tt;
  tt_local = (TableType *)this;
  std::make_unique<wabt::interp::TableType,wabt::interp::TableType&>((TableType *)local_28);
  std::unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>>::
  unique_ptr<wabt::interp::TableType,std::default_delete<wabt::interp::TableType>,void>
            ((unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>> *)
             &local_20,
             (unique_ptr<wabt::interp::TableType,_std::default_delete<wabt::interp::TableType>_> *)
             local_28);
  wasm_externtype_t::wasm_externtype_t(&this->super_wasm_externtype_t,&local_20);
  std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
  ~unique_ptr(&local_20);
  std::unique_ptr<wabt::interp::TableType,_std::default_delete<wabt::interp::TableType>_>::
  ~unique_ptr((unique_ptr<wabt::interp::TableType,_std::default_delete<wabt::interp::TableType>_> *)
              local_28);
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_tabletype_t_0046dc70;
  (this->elemtype).I = *(ValueType *)&(tt->super_ExternType).field_0xc;
  wVar1 = FromWabtLimits(&tt->limits);
  this->limits = wVar1;
  return;
}

Assistant:

wasm_tabletype_t(TableType tt)
      : wasm_externtype_t{std::make_unique<TableType>(tt)},
        elemtype{tt.element},
        limits{FromWabtLimits(tt.limits)} {}